

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

double __thiscall IF97::Region3::delta2_d2phi_ddelta2(Region3 *this,double T,double rho)

{
  double dVar1;
  int i_00;
  double dVar2;
  double dVar3;
  size_t i;
  long lVar4;
  double dVar5;
  
  dVar5 = -*(this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar4 = 1; lVar4 != 0x28; lVar4 = lVar4 + 1) {
    i_00 = (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar4];
    dVar1 = (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4];
    dVar2 = powi(rho / 322.0,i_00);
    dVar3 = powi(647.096 / T,
                 (this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4]);
    dVar5 = dVar5 + dVar3 * dVar2 * (double)(i_00 + -1) * (double)i_00 * dVar1;
  }
  return dVar5;
}

Assistant:

double delta2_d2phi_ddelta2(double T, double rho) const{
            const double delta = rho/Rhocrit, tau = Tcrit/T;
            double summer = -nr[0];
            for (std::size_t i = 1; i < 40; ++i){
                summer += nr[i]*Ir[i]*(Ir[i]-1)*powi(delta, Ir[i])*powi(tau, Jr[i]);
            }
            return summer;
        }